

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_abi(jit_State *J,RecordFFData *rd)

{
  undefined2 uVar1;
  TRef TVar2;
  undefined8 in_RSI;
  GCobj *in_RDI;
  TraceError in_stack_ffffffffffffffcc;
  jit_State *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  GCobj *pGVar3;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  undefined2 in_stack_fffffffffffffff4;
  undefined2 in_stack_fffffffffffffff6;
  
  if ((**(uint **)(in_RDI + 2) & 0x1f000000) == 0x4000000) {
    uVar1 = (undefined2)**(undefined4 **)(in_RDI + 2);
    pGVar3 = in_RDI;
    TVar2 = lj_ir_kgc((jit_State *)
                      CONCAT26(in_stack_fffffffffffffff6,
                               CONCAT24(in_stack_fffffffffffffff4,
                                        CONCAT22(in_stack_fffffffffffffff2,in_stack_fffffffffffffff0
                                                ))),in_RDI,(IRType)((ulong)in_RSI >> 0x20));
    *(undefined2 *)((long)in_RDI + 0x9c) = 0x884;
    *(undefined2 *)((long)in_RDI + 0x98) = uVar1;
    *(short *)((long)in_RDI + 0x9a) = (short)TVar2;
    lj_opt_fold((jit_State *)CONCAT26(uVar1,in_stack_ffffffffffffffd8));
    *(undefined4 *)((long)pGVar3 + 300) = 4;
    **(undefined4 **)(pGVar3 + 2) = 0x2007ffd;
    return;
  }
  lj_trace_err(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
}

Assistant:

void LJ_FASTCALL recff_ffi_abi(jit_State *J, RecordFFData *rd)
{
  if (tref_isstr(J->base[0])) {
    /* Specialize to the ABI string to make the boolean result a constant. */
    emitir(IRTG(IR_EQ, IRT_STR), J->base[0], lj_ir_kstr(J, strV(&rd->argv[0])));
    J->postproc = LJ_POST_FIXBOOL;
    J->base[0] = TREF_TRUE;
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
}